

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

SegmentList * __thiscall gepard::SegmentApproximator::segments_abi_cxx11_(SegmentApproximator *this)

{
  Float *pFVar1;
  double dVar2;
  double dVar3;
  Float FVar4;
  list<gepard::Segment,_std::allocator<gepard::Segment>_> *plVar5;
  iterator iVar6;
  bool bVar7;
  reference ppVar8;
  reference segment_00;
  _Self *p_Var9;
  reference piVar10;
  _Base_ptr this_00;
  pointer ppVar11;
  pointer pSVar12;
  double dVar13;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar14;
  _Self local_138;
  _Self local_130;
  iterator furtherSegment;
  _Self local_120;
  iterator segment_1;
  bool needSorting;
  SegmentList *currentList_1;
  _Self local_100;
  iterator currentSegments_1;
  SegmentList *segments;
  iterator iStack_e8;
  int y_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1_1;
  int local_bc;
  _Base_ptr local_b8;
  undefined1 local_b0;
  int local_a4;
  double dStack_a0;
  int intersectionY;
  Float y;
  _Self local_90;
  _Self local_88;
  iterator segment;
  iterator currentSegment;
  SegmentList *currentList;
  pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>
  *currentSegments;
  iterator __end1;
  iterator __begin1;
  SegmentTree *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> ys;
  SegmentApproximator *this_local;
  
  ys._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  splitSegments(this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end1 = std::
           map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
           ::begin(&this->_segments);
  currentSegments =
       (pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*> *)
       std::
       map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
       ::end(&this->_segments);
  while (bVar7 = std::operator!=(&__end1,(_Self *)&currentSegments), bVar7) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
             ::operator*(&__end1);
    plVar5 = ppVar8->second;
    std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::sort(plVar5);
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::begin(plVar5);
    segment = (iterator)local_88._M_node;
    while( true ) {
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::end(plVar5);
      bVar7 = std::operator!=(&segment,&local_90);
      if (!bVar7) break;
      y = (Float)std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::end(plVar5);
      bVar7 = std::operator!=(&local_88,(_Self *)&y);
      if (bVar7) {
        pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&segment);
        segment_00 = std::_List_iterator<gepard::Segment>::operator*(&local_88);
        bVar7 = Segment::computeIntersectionY(pSVar12,segment_00,&stack0xffffffffffffff60);
        if (bVar7) {
          dVar13 = floor(dStack_a0);
          local_a4 = (int)dVar13;
          pVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_a4)
          ;
          local_b8 = (_Base_ptr)pVar14.first._M_node;
          local_b0 = pVar14.second;
          if (((double)local_a4 != dStack_a0) || (NAN((double)local_a4) || NAN(dStack_a0))) {
            if (dStack_a0 <= (double)local_a4) {
              __assert_fail("(Float)intersectionY < y",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                            ,0x1f5,"SegmentList *gepard::SegmentApproximator::segments()");
            }
            local_bc = local_a4 + 1;
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_bc);
          }
        }
      }
      else {
        p_Var9 = std::_List_iterator<gepard::Segment>::operator++(&segment);
        local_88._M_node = p_Var9->_M_node;
      }
      std::_List_iterator<gepard::Segment>::operator++(&local_88);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  iStack_e8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  while (bVar7 = std::operator!=(&__end1_1,&stack0xffffffffffffff18), bVar7) {
    piVar10 = std::_Rb_tree_const_iterator<int>::operator*(&__end1_1);
    insertSegmentList_abi_cxx11_(this,*piVar10);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1_1);
  }
  splitSegments(this);
  this_00 = (_Base_ptr)operator_new(0x18);
  memset(this_00,0,0x18);
  std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::list
            ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)this_00);
  currentSegments_1._M_node = this_00;
  local_100._M_node =
       (_Base_ptr)
       std::
       map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
       ::begin(&this->_segments);
  do {
    currentList_1 =
         (SegmentList *)
         std::
         map<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
         ::end(&this->_segments);
    bVar7 = std::operator!=(&local_100,(_Self *)&currentList_1);
    iVar6 = currentSegments_1;
    if (!bVar7) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      return (SegmentList *)iVar6._M_node;
    }
    ppVar11 = std::
              _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
              ::operator->(&local_100);
    plVar5 = ppVar11->second;
    std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::sort(plVar5);
    segment_1._M_node._7_1_ = 0;
    local_120._M_node =
         (_List_node_base *)
         std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::begin(plVar5);
    while( true ) {
      furtherSegment =
           std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::end(plVar5);
      bVar7 = std::operator!=(&local_120,&furtherSegment);
      if (!bVar7) break;
      pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
      dVar13 = (pSVar12->to).y;
      pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
      if (dVar13 - (pSVar12->from).y < 1.0) {
        __assert_fail("segment->to.y - segment->from.y >= 1.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                      ,0x20f,"SegmentList *gepard::SegmentApproximator::segments()");
      }
      pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
      dVar13 = (pSVar12->to).y;
      pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
      dVar13 = dVar13 - (pSVar12->from).y;
      if ((dVar13 == 1.0) && (!NAN(dVar13))) {
        local_130._M_node = local_120._M_node;
        while( true ) {
          local_138._M_node =
               (_List_node_base *)
               std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::end(plVar5);
          bVar7 = std::operator!=(&local_130,&local_138);
          if (!bVar7) break;
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
          dVar13 = (pSVar12->from).y;
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
          pFVar1 = &(pSVar12->from).y;
          if ((dVar13 != *pFVar1) || (NAN(dVar13) || NAN(*pFVar1))) {
            __assert_fail("segment->from.y == furtherSegment->from.y",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                          ,0x212,"SegmentList *gepard::SegmentApproximator::segments()");
          }
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
          dVar13 = (pSVar12->to).y;
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
          pFVar1 = &(pSVar12->to).y;
          if ((dVar13 != *pFVar1) || (NAN(dVar13) || NAN(*pFVar1))) {
            __assert_fail("segment->to.y == furtherSegment->to.y",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                          ,0x213,"SegmentList *gepard::SegmentApproximator::segments()");
          }
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
          dVar13 = (pSVar12->to).x;
          pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
          if (dVar13 < (pSVar12->to).x) {
            pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
            dVar13 = (pSVar12->from).x;
            pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
            dVar2 = (pSVar12->from).x;
            pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
            dVar3 = (pSVar12->to).x;
            pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
            if (dVar3 - (pSVar12->to).x <= dVar13 - dVar2) {
              pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
              FVar4 = (pSVar12->to).x;
              pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
              (pSVar12->to).x = FVar4;
            }
            else {
              pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_120);
              FVar4 = (pSVar12->from).x;
              pSVar12 = std::_List_iterator<gepard::Segment>::operator->(&local_130);
              (pSVar12->from).x = FVar4;
              segment_1._M_node._7_1_ = 1;
            }
          }
          std::_List_iterator<gepard::Segment>::operator++(&local_130);
        }
      }
      std::_List_iterator<gepard::Segment>::operator++(&local_120);
    }
    if ((segment_1._M_node._7_1_ & 1) == 0) {
      std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::merge
                ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)
                 currentSegments_1._M_node,plVar5);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
      ::operator--(&local_100);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>
    ::operator++(&local_100);
  } while( true );
}

Assistant:

SegmentList* SegmentApproximator::segments()
{
    // Split segments with all y lines.
    splitSegments();

    // Find all intersection points.
    std::set<int> ys;
    for (auto& currentSegments : _segments) {
        SegmentList* currentList = currentSegments.second;
        currentList->sort();
        SegmentList::iterator currentSegment = currentList->begin();
        for (SegmentList::iterator segment = currentSegment; currentSegment != currentList->end(); ++segment) {
            if (segment != currentList->end()) {
                Float y;
                if (currentSegment->computeIntersectionY(&(*segment), y)) {
                    const int intersectionY = std::floor(y);
                    ys.insert(intersectionY);
                    if ((Float)intersectionY != y) {
                        GD_ASSERT((Float)intersectionY < y);
                        ys.insert(intersectionY + 1);
                    }
                }
            } else {
                segment = ++currentSegment;
            }
        }
    }

    for (auto y : ys) {
        insertSegmentList(y);
    }

    // Split segments with all y lines.
    splitSegments();

    // Merge and sort all segment list.
    SegmentList* segments = new SegmentList();
    for (SegmentTree::iterator currentSegments = _segments.begin(); currentSegments != _segments.end(); ++currentSegments) {
        SegmentList* currentList = currentSegments->second;
        currentList->sort();

        bool needSorting = false;
        // Fix intersection pairs.
        for (SegmentList::iterator segment = currentList->begin(); segment != currentList->end(); ++segment) {
            GD_ASSERT(segment->to.y - segment->from.y >= 1.0);
            if (segment->to.y - segment->from.y == 1.0) {
                for (SegmentList::iterator furtherSegment = segment; furtherSegment != currentList->end() ; ++furtherSegment) {
                    GD_ASSERT(segment->from.y == furtherSegment->from.y);
                    GD_ASSERT(segment->to.y == furtherSegment->to.y);
                    //! \todo(szledan): need to test this assert:
                    //! GD_ASSERT(furtherSegment->from.x >= segment->from.x)
                    if (furtherSegment->to.x < segment->to.x) {
                        if (furtherSegment->from.x - segment->from.x < segment->to.x - furtherSegment->to.x) {
                            furtherSegment->from.x = segment->from.x;
                            needSorting = true;
                        } else {
                            furtherSegment->to.x = segment->to.x;
                        }
                    }
                }
            }
        }
        if (needSorting) {
            --currentSegments;
        } else {
            // Merge segment lists.
            segments->merge(*currentList);
        }
    }

    // Return independent segments.
    return segments;
}